

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.h
# Opt level: O1

void __thiscall
Potassco::ProgramOptions::UnknownOption::UnknownOption(UnknownOption *this,string *ctx,string *key)

{
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  ContextError::ContextError(&this->super_ContextError,ctx,unknown_option,key,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  *(undefined ***)&(this->super_ContextError).super_Error = &PTR__ContextError_001e8f60;
  return;
}

Assistant:

UnknownOption(const std::string& ctx, const std::string& key) : ContextError(ctx, ContextError::unknown_option, key) {}